

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraClaus.c
# Opt level: O1

Clu_Man_t *
Fra_ClausAlloc(Aig_Man_t *pAig,int nFrames,int nPref,int nClausesMax,int nLutSize,int nLevels,
              int nCutsMax,int nBatches,int fStepUp,int fTarget,int fVerbose,int fVeryVerbose)

{
  ulong uVar1;
  int iVar2;
  undefined8 *puVar3;
  Clu_Man_t *__s;
  Vec_Int_t *pVVar4;
  int *piVar5;
  void **ppvVar6;
  void **ppvVar7;
  Vec_Ptr_t *pVVar8;
  ulong uVar9;
  long lVar10;
  int iVar11;
  
  __s = (Clu_Man_t *)malloc(0xb8);
  memset(__s,0,0xb8);
  __s->pAig = pAig;
  __s->nFrames = nFrames;
  __s->nPref = nPref;
  __s->nClausesMax = nClausesMax;
  __s->nLutSize = nLutSize;
  __s->nLevels = nLevels;
  __s->nCutsMax = nCutsMax;
  __s->nBatches = nBatches;
  __s->fStepUp = fStepUp;
  __s->fTarget = fTarget;
  __s->fVerbose = fVerbose;
  __s->fVeryVerbose = fVeryVerbose;
  __s->nSimWords = 0x200;
  __s->nSimFrames = 0x20;
  __s->nSimWordsPref = nPref << 4;
  pVVar4 = (Vec_Int_t *)malloc(0x10);
  pVVar4->nCap = 0x4000;
  pVVar4->nSize = 0;
  piVar5 = (int *)malloc(0x10000);
  pVVar4->pArray = piVar5;
  __s->vLits = pVVar4;
  pVVar4 = (Vec_Int_t *)malloc(0x10);
  pVVar4->nCap = 0x1000;
  pVVar4->nSize = 0;
  piVar5 = (int *)malloc(0x4000);
  pVVar4->pArray = piVar5;
  __s->vClauses = pVVar4;
  pVVar4 = (Vec_Int_t *)malloc(0x10);
  pVVar4->nCap = 0x1000;
  pVVar4->nSize = 0;
  piVar5 = (int *)malloc(0x4000);
  pVVar4->pArray = piVar5;
  __s->vCosts = pVVar4;
  pVVar4 = (Vec_Int_t *)malloc(0x10);
  pVVar4->nCap = 0x4000;
  pVVar4->nSize = 0;
  piVar5 = (int *)malloc(0x10000);
  pVVar4->pArray = piVar5;
  __s->vLitsProven = pVVar4;
  pVVar4 = (Vec_Int_t *)malloc(0x10);
  pVVar4->nCap = 0x1000;
  pVVar4->nSize = 0;
  piVar5 = (int *)malloc(0x4000);
  pVVar4->pArray = piVar5;
  __s->vClausesProven = pVVar4;
  __s->nCexesAlloc = 0x400;
  iVar2 = pAig->vObjs->nSize;
  lVar10 = (long)iVar2;
  uVar1 = lVar10 + 1;
  ppvVar6 = (void **)malloc(uVar1 * 0x80 + lVar10 * 8 + 8);
  iVar11 = (int)uVar1;
  if (lVar10 < 0) {
    pVVar8 = (Vec_Ptr_t *)malloc(0x10);
    pVVar8->nSize = iVar11;
    pVVar8->nCap = iVar11;
    pVVar8->pArray = ppvVar6;
    __s->vCexes = pVVar8;
  }
  else {
    ppvVar7 = ppvVar6 + lVar10 + 1;
    uVar9 = 0;
    do {
      ppvVar6[uVar9] = ppvVar7;
      uVar9 = uVar9 + 1;
      ppvVar7 = ppvVar7 + 0x10;
    } while ((uVar1 & 0xffffffff) != uVar9);
    pVVar8 = (Vec_Ptr_t *)malloc(0x10);
    pVVar8->nSize = iVar11;
    pVVar8->nCap = iVar11;
    pVVar8->pArray = ppvVar6;
    __s->vCexes = pVVar8;
    if (-1 < iVar2) {
      uVar9 = 0;
      do {
        puVar3 = (undefined8 *)ppvVar6[uVar9];
        puVar3[0xe] = 0;
        puVar3[0xf] = 0;
        puVar3[0xc] = 0;
        puVar3[0xd] = 0;
        puVar3[10] = 0;
        puVar3[0xb] = 0;
        puVar3[8] = 0;
        puVar3[9] = 0;
        puVar3[6] = 0;
        puVar3[7] = 0;
        puVar3[4] = 0;
        puVar3[5] = 0;
        puVar3[2] = 0;
        puVar3[3] = 0;
        *puVar3 = 0;
        puVar3[1] = 0;
        uVar9 = uVar9 + 1;
      } while (uVar1 != uVar9);
    }
  }
  return __s;
}

Assistant:

Clu_Man_t * Fra_ClausAlloc( Aig_Man_t * pAig, int nFrames, int nPref, int nClausesMax, int nLutSize, int nLevels, int nCutsMax, int nBatches, int fStepUp, int fTarget, int fVerbose, int fVeryVerbose )
{
    Clu_Man_t * p;
    p = ABC_ALLOC( Clu_Man_t, 1 );
    memset( p, 0, sizeof(Clu_Man_t) );
    p->pAig          = pAig;
    p->nFrames       = nFrames;
    p->nPref         = nPref;
    p->nClausesMax   = nClausesMax;
    p->nLutSize      = nLutSize;
    p->nLevels       = nLevels;
    p->nCutsMax      = nCutsMax;
    p->nBatches      = nBatches;
    p->fStepUp       = fStepUp;
    p->fTarget       = fTarget;
    p->fVerbose      = fVerbose;
    p->fVeryVerbose  = fVeryVerbose;
    p->nSimWords     = 512;//1024;//64;
    p->nSimFrames    = 32;//8;//32;
    p->nSimWordsPref = p->nPref*p->nSimWords/p->nSimFrames;

    p->vLits         = Vec_IntAlloc( 1<<14 );
    p->vClauses      = Vec_IntAlloc( 1<<12 );
    p->vCosts        = Vec_IntAlloc( 1<<12 );

    p->vLitsProven   = Vec_IntAlloc( 1<<14 );
    p->vClausesProven= Vec_IntAlloc( 1<<12 );

    p->nCexesAlloc   = 1024;
    p->vCexes        = Vec_PtrAllocSimInfo( Aig_ManObjNumMax(p->pAig)+1, p->nCexesAlloc/32 );
    Vec_PtrCleanSimInfo( p->vCexes, 0, p->nCexesAlloc/32 );
    return p;
}